

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

void __thiscall cppnet::PoolAlloter::PoolAlloter(PoolAlloter *this)

{
  reference ppMVar1;
  shared_ptr<cppnet::NormalAlloter> local_38;
  __normal_iterator<cppnet::PoolAlloter::MemNode_**,_std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>_>
  local_28 [3];
  PoolAlloter *local_10;
  PoolAlloter *this_local;
  
  local_10 = this;
  Alloter::Alloter(&this->super_Alloter);
  (this->super_Alloter)._vptr_Alloter = (_func_int **)&PTR__PoolAlloter_00166560;
  this->_pool_start = (char *)0x0;
  this->_pool_end = (char *)0x0;
  std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>::
  vector(&this->_free_list);
  std::vector<char_*,_std::allocator<char_*>_>::vector(&this->_malloc_vec);
  std::shared_ptr<cppnet::Alloter>::shared_ptr(&this->_alloter);
  std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>::
  resize(&this->_free_list,0x20);
  local_28[0]._M_current =
       (MemNode **)
       std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
       ::begin(&this->_free_list);
  ppMVar1 = __gnu_cxx::
            __normal_iterator<cppnet::PoolAlloter::MemNode_**,_std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>_>
            ::operator*(local_28);
  ppMVar1[0x1e] = (MemNode *)0x0;
  ppMVar1[0x1f] = (MemNode *)0x0;
  ppMVar1[0x1c] = (MemNode *)0x0;
  ppMVar1[0x1d] = (MemNode *)0x0;
  ppMVar1[0x1a] = (MemNode *)0x0;
  ppMVar1[0x1b] = (MemNode *)0x0;
  ppMVar1[0x18] = (MemNode *)0x0;
  ppMVar1[0x19] = (MemNode *)0x0;
  ppMVar1[0x16] = (MemNode *)0x0;
  ppMVar1[0x17] = (MemNode *)0x0;
  ppMVar1[0x14] = (MemNode *)0x0;
  ppMVar1[0x15] = (MemNode *)0x0;
  ppMVar1[0x12] = (MemNode *)0x0;
  ppMVar1[0x13] = (MemNode *)0x0;
  ppMVar1[0x10] = (MemNode *)0x0;
  ppMVar1[0x11] = (MemNode *)0x0;
  ppMVar1[0xe] = (MemNode *)0x0;
  ppMVar1[0xf] = (MemNode *)0x0;
  ppMVar1[0xc] = (MemNode *)0x0;
  ppMVar1[0xd] = (MemNode *)0x0;
  ppMVar1[10] = (MemNode *)0x0;
  ppMVar1[0xb] = (MemNode *)0x0;
  ppMVar1[8] = (MemNode *)0x0;
  ppMVar1[9] = (MemNode *)0x0;
  ppMVar1[6] = (MemNode *)0x0;
  ppMVar1[7] = (MemNode *)0x0;
  ppMVar1[4] = (MemNode *)0x0;
  ppMVar1[5] = (MemNode *)0x0;
  ppMVar1[2] = (MemNode *)0x0;
  ppMVar1[3] = (MemNode *)0x0;
  *ppMVar1 = (MemNode *)0x0;
  ppMVar1[1] = (MemNode *)0x0;
  MakeNormalAlloterPtr();
  std::shared_ptr<cppnet::Alloter>::operator=(&this->_alloter,&local_38);
  std::shared_ptr<cppnet::NormalAlloter>::~shared_ptr(&local_38);
  return;
}

Assistant:

PoolAlloter::PoolAlloter() : 
    _pool_start(nullptr),
    _pool_end(nullptr) {
    _free_list.resize(__default_number_of_free_lists);
    memset(&(*_free_list.begin()), 0, sizeof(void*) * __default_number_of_free_lists);
    _alloter = MakeNormalAlloterPtr();
}